

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasmFPU_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmFTrapcc<(moira::Instr)202,(moira::Mode)12,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  Syntax SVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  char cVar7;
  
  uVar1 = *addr;
  *addr = uVar1 + 2;
  uVar3 = (*this->_vptr_Moira[6])();
  if ((0x1f < (ushort)uVar3) && ((str->style->syntax & ~MOIRA_MIT) == GNU)) {
    *addr = uVar1;
    dasmIllegal<(moira::Instr)202,(moira::Mode)12,2>(this,str,addr,op);
    return;
  }
  cVar7 = 'f';
  lVar6 = 1;
  do {
    pcVar5 = str->ptr;
    str->ptr = pcVar5 + 1;
    *pcVar5 = cVar7;
    cVar7 = "ftrap"[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 6);
  StrWriter::operator<<(str,(Fcc)(uVar3 & 0x3f));
  pcVar5 = str->ptr;
  SVar2 = str->style->syntax;
  str->ptr = pcVar5 + 1;
  if (2 < SVar2 - MOIRA_MIT) {
    *pcVar5 = '.';
    pcVar5 = str->ptr;
    str->ptr = pcVar5 + 1;
  }
  *pcVar5 = 'w';
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    pcVar5 = str->ptr;
    str->ptr = pcVar5 + 1;
    *pcVar5 = ' ';
  }
  else {
    iVar4 = (str->tab).raw;
    pcVar5 = str->ptr;
    do {
      str->ptr = pcVar5 + 1;
      *pcVar5 = ' ';
      pcVar5 = str->ptr;
    } while (pcVar5 < str->base + iVar4);
  }
  *addr = *addr + 2;
  iVar4 = (*this->_vptr_Moira[6])(this);
  pcVar5 = str->ptr;
  str->ptr = pcVar5 + 1;
  *pcVar5 = '#';
  StrWriter::operator<<(str,(Int)(int)(short)iVar4);
  return;
}

Assistant:

void
Moira::dasmFTrapcc(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead(addr);
    auto cnd = __________xxxxxx (ext);

    // Catch illegal extension words
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        if (!isValidExtFPU(I, M, op, ext)) {

            addr = old;
            dasmIllegal<I, M, S>(str, addr, op);
            return;
        }
    }

    switch (S) {

        case Unsized:

            str << Ins<I>{} << Fcc{cnd} << " ";
            break;

        case Word:
        case Long:

            str << Ins<I>{} << Fcc{cnd} << Sz<S>{} << str.tab << Ims<S>(dasmIncRead<S>(addr));
            break;
    }
}